

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O3

void key_press_proc(Am_Object *self)

{
  long lVar1;
  Am_Input_Char AVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  short *psVar6;
  ostream *poVar7;
  Am_Value *pAVar8;
  undefined1 uVar9;
  ushort uVar10;
  ulong uVar11;
  Am_Object AVar12;
  Am_Point_List pl;
  float y1;
  float x1;
  Am_Object inter;
  Am_Input_Char startc;
  Am_Point_List local_98 [16];
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60 [2];
  Am_Object local_50 [3];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [12];
  undefined2 local_14;
  ushort local_12;
  
  Am_Object::Get_Object((ushort)local_50,(ulong)self);
  psVar6 = (short *)Am_Object::Get((ushort)local_50,0x11b);
  lVar1 = *(long *)(psVar6 + 4);
  if ((lVar1 != 0) && (*psVar6 != (short)Am_Input_Char::Am_Input_Char_ID)) {
    Am_Error();
LAB_00106afd:
    iVar5 = __cxa_guard_acquire(&key_press_proc(Am_Object)::copy_point_list);
    if (iVar5 != 0) {
      Am_Point_List::Am_Point_List((Am_Point_List *)key_press_proc(Am_Object)::copy_point_list);
      __cxa_atexit(Am_Point_List::~Am_Point_List,key_press_proc(Am_Object)::copy_point_list,
                   &__dso_handle);
      __cxa_guard_release(&key_press_proc(Am_Object)::copy_point_list);
    }
LAB_001062fa:
    pAVar8 = (Am_Value *)Am_Object::Get(0xf500,0xb2);
    Am_Point_List::Am_Point_List(local_98,pAVar8);
    (*(code *)((long)&DAT_0010b0bc +
              (long)(int)(&DAT_0010b0bc)[key_press_proc::polygonanimationcnt - 1]))();
    return;
  }
  local_14 = (undefined2)lVar1;
  local_12 = (ushort)((ulong)lVar1 >> 0x10) & 0xfff;
  cVar3 = Am_Input_Char::As_Char();
  switch(cVar3) {
  case 'N':
    Create_Bouncing_Button();
    goto LAB_001063f6;
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 't':
  case 'u':
    goto switchD_00105cb7_caseD_4f;
  case 'V':
    pAVar8 = (Am_Value *)Am_Object::Get(0xf5e8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    if ((6U >> (key_press_proc::dogvisibleanimationcnt & 0x1fU) & 1) == 0) {
      if ((0x18U >> (key_press_proc::dogvisibleanimationcnt & 0x1fU) & 1) == 0) {
        Am_Object::Set(0xf600,100,500);
        Am_Object::Set(0xf600,(Am_Value *)0x65,(ulong)&Am_No_Value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"setting visible to ",0x13);
        poVar7 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," from x=500 only ",0x11);
      }
      else {
        Am_Object::Set(0xf600,(Am_Value *)0x64,(ulong)&Am_No_Value);
        Am_Object::Set(0xf600,0x65,100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"setting visible to ",0x13);
        poVar7 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," from Y=100 only ",0x11);
      }
    }
    else {
      Am_Object::Set(0xf600,100,0xfffffc18);
      Am_Object::Set(0xf600,0x65,0xfffffc18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"setting visible to ",0x13);
      poVar7 = std::ostream::_M_insert<bool>(true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," from -1000,-1000 ",0x12);
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ostream::flush();
    key_press_proc::dogvisibleanimationcnt = (uint)key_press_proc::dogvisibleanimationcnt % 6 + 1;
    Am_Object::Set(0xf5e8,true,(ulong)!bVar4);
    goto LAB_001063f6;
  case 'a':
    uVar10 = 0xf4c0;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4c0,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'b':
    uVar10 = 0xf5f0;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf5f0,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'c':
    uVar10 = 0xf608;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf608,0x107);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    uVar9 = 7;
    goto LAB_001063e4;
  case 'd':
    uVar10 = 0xf5f8;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf5f8,0xcc);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    goto LAB_001062e3;
  case 'e':
    if (key_press_proc::walking == true) {
      Am_Object::Am_Object(local_60,&anim7);
      Am_Abort_Interactor((Am_Object_Data *)local_60,true);
      Am_Object::~Am_Object(local_60);
      AVar12.data = (Am_Object_Data *)local_20;
      Am_Object::Am_Object((Am_Object *)AVar12.data,&change_pic_anim);
      Am_Abort_Animator(AVar12);
    }
    else {
      Am_Object::Am_Object(&local_68,&anim7);
      Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
      AVar2 = _Am_Default_Start_Char;
      Am_Object::Am_Object(&local_78,(Am_Object *)&Am_No_Object);
      Am_Start_Interactor((Am_Object_Data *)&local_68,(Am_Object_Data *)&local_70,AVar2,
                          (Am_Object_Data *)&local_78,0,0,true);
      Am_Object::~Am_Object(&local_78);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(&local_68);
      AVar12.data = (Am_Object_Data *)local_28;
      Am_Object::Am_Object((Am_Object *)AVar12.data,&change_pic_anim);
      Am_Start_Animator(AVar12,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
    }
    Am_Object::~Am_Object((Am_Object *)AVar12.data);
    key_press_proc::walking = (bool)(key_press_proc::walking ^ 1);
    goto LAB_001063f6;
  case 'f':
    uVar10 = 0xf4d8;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4d8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'g':
    uVar10 = 0xf5e0;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf5e0,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'h':
    uVar10 = 0xf4c8;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4c8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'i':
    Am_Set_Inter_Trace(key_press_proc::debugging ^ Am_INTER_TRACE_ALL);
    key_press_proc::debugging = (bool)(key_press_proc::debugging ^ 1);
    goto LAB_001063f6;
  case 'm':
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4b8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    if ((6U >> (key_press_proc::visibleanimationcnt & 0x1fU) & 1) == 0) {
      if ((0x18U >> (key_press_proc::visibleanimationcnt & 0x1fU) & 1) == 0) {
        Am_Object::Set(0xf5d0,(Am_Value *)0x66,(ulong)&Am_No_Value);
        Am_Object::Set(0xf5d0,0x67,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," setting visible to ",0x14);
        poVar7 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," shrink in Y only",0x11);
      }
      else {
        Am_Object::Set(0xf5d0,0x66,1);
        Am_Object::Set(0xf5d0,(Am_Value *)0x67,(ulong)&Am_No_Value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," setting visible to ",0x14);
        poVar7 = std::ostream::_M_insert<bool>(true);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," shrink in X only",0x11);
      }
    }
    else {
      Am_Object::Set(0xf5d0,0x66,1);
      Am_Object::Set(0xf5d0,0x67,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," setting visible to ",0x14);
      poVar7 = std::ostream::_M_insert<bool>(true);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," in X and Y",0xb);
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    std::ostream::flush();
    key_press_proc::visibleanimationcnt = (uint)key_press_proc::visibleanimationcnt % 6 + 1;
    Am_Object::Set(0xf4b8,true,(ulong)!bVar4);
    goto LAB_001063f6;
  case 'o':
    uVar10 = 0xf610;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf610,0xcc);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
LAB_001062e3:
    uVar9 = 0xcc;
    goto LAB_001063e4;
  case 'p':
    if (key_press_proc(Am_Object)::copy_point_list != '\0') goto LAB_001062fa;
    goto LAB_00106afd;
  case 'q':
    Am_Exit_Main_Event_Loop();
    goto LAB_001063f6;
  case 'r':
    uVar10 = 0xf4b8;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4b8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 's':
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4b8,100);
    iVar5 = Am_Value::operator_cast_to_int(pAVar8);
    if (iVar5 == 500) {
      uVar11 = 0x7d;
      Am_Object::Set(0xf4b8,100,0xaf);
    }
    else {
      uVar11 = 500;
      Am_Object::Set(0xf4b8,100,500);
    }
    Am_Object::Set(0xf4b8,0x65,uVar11);
    goto LAB_001063f6;
  case 'v':
    uVar10 = 0xf4e8;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4e8,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  case 'w':
    uVar10 = 0xf4d0;
    pAVar8 = (Am_Value *)Am_Object::Get(0xf4d0,0x69);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
    break;
  default:
    if (cVar3 == 'A') {
      if (key_press_proc::visblinking == true) {
        Am_Object::Am_Object(&local_80,&wiggler_vis_blink);
        Am_Abort_Animator((Am_Object_Data *)&local_80);
        Am_Object::~Am_Object(&local_80);
        Am_Object::Set(0xf4d0,true,1);
      }
      else {
        Am_Object::Am_Object(&local_88,&wiggler_vis_blink);
        Am_Start_Animator((Am_Object_Data *)&local_88,(Am_Value *)&Am_No_Value,
                          (Am_Value *)&Am_No_Value);
        Am_Object::~Am_Object(&local_88);
      }
      key_press_proc::visblinking = (bool)(key_press_proc::visblinking ^ 1);
      goto LAB_001063f6;
    }
    if (cVar3 == 'B') {
      if (key_press_proc::blinking == true) {
        AVar12.data = (Am_Object_Data *)local_30;
        Am_Object::Am_Object((Am_Object *)AVar12.data,&wiggler_blink);
        Am_Abort_Animator(AVar12);
      }
      else {
        AVar12.data = (Am_Object_Data *)local_38;
        Am_Object::Am_Object((Am_Object *)AVar12.data,&wiggler_blink);
        Am_Start_Animator(AVar12,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
      }
      Am_Object::~Am_Object((Am_Object *)AVar12.data);
      key_press_proc::blinking = (bool)(key_press_proc::blinking ^ 1);
      goto LAB_001063f6;
    }
    goto switchD_00105cb7_caseD_4f;
  }
  uVar9 = 0x69;
LAB_001063e4:
  Am_Object::Set(uVar10,(bool)uVar9,(ulong)(bVar4 ^ 1));
LAB_001063f6:
  Am_Object::~Am_Object(local_50);
  return;
switchD_00105cb7_caseD_4f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Commands:",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"a to toggle 2D animator",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"f to toggle fixed-time animator",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"h to toggle hopping animator",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"w to toggle wiggling animator",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"s to set red rectangle\'s left & top",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"c to toggle RGB and HSV color paths",0x23);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"r to hide red rectangle\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"i = toggle interactor (animator) tracing\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"m = grow visible animate rectangle\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"o = toggle animation on 1st option menu\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"p = test polygon animation\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"e = toggle eye walking",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"For icons:\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   g = toggle girl\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   d = toggle dog animation\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   b = toggle bug\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"   v = toggle visible on group (fade out)\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"   V = toggle visible on dog (fly away)\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," A = blink wiggler visible\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," B = blink wiggler blue and green\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," N = create new window with animated button\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"q to quit",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ostream::flush();
  goto LAB_001063f6;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char startc = inter.Get(Am_START_CHAR);
  int c = startc.As_Char();

  if (c == 'q')
    Am_Exit_Main_Event_Loop();
  else if (c == 's') {
    if ((int)Mover.Get(Am_LEFT) == 500) {
      Mover.Set(Am_LEFT, 175);
      Mover.Set(Am_TOP, 125);
    } else {
      Mover.Set(Am_LEFT, 500);
      Mover.Set(Am_TOP, 500);
    }
  } else if (c == 'a')
    Animator.Set(Am_VISIBLE, !(bool)Animator.Get(Am_VISIBLE));
  else if (c == 'f')
    fixed_time.Set(Am_VISIBLE, !(bool)fixed_time.Get(Am_VISIBLE));
  else if (c == 'h')
    hopper.Set(Am_VISIBLE, !(bool)hopper.Get(Am_VISIBLE));
  else if (c == 'w')
    wiggler.Set(Am_VISIBLE, !(bool)wiggler.Get(Am_VISIBLE));
  else if (c == 'e') {
    static bool walking = true;
    if (walking) {
      Am_Abort_Interactor(anim7);
      Am_Abort_Animator(change_pic_anim);
    } else {
      Am_Start_Interactor(anim7);
      Am_Start_Animator(change_pic_anim);
    }
    walking = !walking;
  } else if (c == 'c')
    coloranimation.Set(Am_RGB_COLOR, !(bool)coloranimation.Get(Am_RGB_COLOR));
  else if (c == 'N')
    Create_Bouncing_Button();
  else if (c == 'B') {
    static bool blinking = false;
    if (blinking) {
      Am_Abort_Animator(wiggler_blink);
    } else {
      Am_Start_Animator(wiggler_blink);
    }
    blinking = !blinking;
  } else if (c == 'A') {
    static bool visblinking = false;
    if (visblinking) {
      Am_Abort_Animator(wiggler_vis_blink);
      wiggler.Set(Am_VISIBLE, true); //might stop with it invisible
    } else {
      Am_Start_Animator(wiggler_vis_blink);
    }
    visblinking = !visblinking;
  } else if (c == 'r')
    Mover.Set(Am_VISIBLE, !(bool)Mover.Get(Am_VISIBLE));
  else if (c == 'i') {
    static bool debugging = false;
    if (!debugging)
      Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);
    else
      Am_Set_Inter_Trace(Am_INTER_TRACE_NONE);
    debugging = !debugging;
  } else if (c == 'm') {
    static int visibleanimationcnt = 1;
    bool new_visible = !(bool)Mover.Get(Am_VISIBLE);
    switch (visibleanimationcnt) {
    case 1:
    case 2:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " in X and Y"
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      rectvisibleanimation.Set(Am_WIDTH, 1);
      rectvisibleanimation.Set(Am_HEIGHT, Am_No_Value);
      std::cout << " setting visible to " << new_visible << " shrink in X only"
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      rectvisibleanimation.Set(Am_WIDTH, Am_No_Value);
      rectvisibleanimation.Set(Am_HEIGHT, 1);
      std::cout << " setting visible to " << new_visible << " shrink in Y only"
                << std::endl
                << std::flush;
      break;
    }
    visibleanimationcnt = (visibleanimationcnt % 6) + 1;
    Mover.Set(Am_VISIBLE, new_visible);
  }
#ifdef TESTUSEPIXMAPS
  else if (c == 'g')
    girl.Set(Am_VISIBLE, !(bool)girl.Get(Am_VISIBLE));
  else if (c == 'b')
    bug.Set(Am_VISIBLE, !(bool)bug.Get(Am_VISIBLE));
  else if (c == 'v')
    fade_group.Set(Am_VISIBLE, !(bool)fade_group.Get(Am_VISIBLE));
  else if (c == 'V') {
    static int dogvisibleanimationcnt = 1;
    bool new_visible = !(bool)dog.Get(Am_VISIBLE);
    switch (dogvisibleanimationcnt) {
    case 1:
    case 2:
      dogvisibleanimation.Set(Am_LEFT, -1000);
      dogvisibleanimation.Set(Am_TOP, -1000);
      std::cout << "setting visible to " << new_visible << " from -1000,-1000 "
                << std::endl
                << std::flush;
      break;
    case 3:
    case 4:
      dogvisibleanimation.Set(Am_LEFT, Am_No_Value);
      dogvisibleanimation.Set(Am_TOP, 100);
      std::cout << "setting visible to " << new_visible << " from Y=100 only "
                << std::endl
                << std::flush;
      break;
    case 5:
    case 6:
      dogvisibleanimation.Set(Am_LEFT, 500);
      dogvisibleanimation.Set(Am_TOP, Am_No_Value);
      std::cout << "setting visible to " << new_visible << " from x=500 only "
                << std::endl
                << std::flush;
      break;
    }
    dogvisibleanimationcnt = (dogvisibleanimationcnt % 6) + 1;
    dog.Set(Am_VISIBLE, new_visible);
  } else if (c == 'd')
    doganimation.Set(Am_ACTIVE, !(bool)doganimation.Get(Am_ACTIVE));
  else if (c == 'o')
    optionvisibleanimation.Set(Am_ACTIVE,
                               !(bool)optionvisibleanimation.Get(Am_ACTIVE));
#endif
  else if (c == 'p') {
    static int polygonanimationcnt = 1;
    static Am_Point_List copy_point_list;
    Am_Point_List pl = polygon.Get(Am_POINT_LIST);

    float x1, y1;
    switch (polygonanimationcnt) {
    case 1: {
      std::cout << "<><>Adding new point to polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Get(x1, y1);
      pl.Insert(x1 - 25, y1 - 50, Am_AFTER);
      break;
    }
    case 2: {
      std::cout << "<><>Removing the new point from polygon old = " << pl;
      pl.Start();
      pl.Next();
      pl.Next();
      pl.Next();
      pl.Delete();
      break;
    }
    case 3: {
      std::cout << "<><>Point list to nothing; old = " << pl;
      pl = Am_Point_List(); // empty list
      break;
    }
    case 4: {
      std::cout << "<><>Point list from nothing; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    case 5: {
      std::cout << "<><>Changing radically to be a star; old = " << pl;
      pl = star_point_list;
      break;
    }
    case 6: {
      std::cout << "<><>Back to triangle; old = " << pl;
      pl = triangle_point_list;
      break;
    }
    }
    polygonanimationcnt = (polygonanimationcnt % 6) + 1;
    std::cout << " new = " << pl << std::endl << std::flush;
    polygon.Set(Am_POINT_LIST, pl);
  } else
    std::cout << "Commands:" << std::endl
              << "a to toggle 2D animator" << std::endl
              << "f to toggle fixed-time animator" << std::endl
              << "h to toggle hopping animator" << std::endl
              << "w to toggle wiggling animator" << std::endl
              << "s to set red rectangle's left & top" << std::endl
              << "c to toggle RGB and HSV color paths" << std::endl
              << "r to hide red rectangle\n"
              << "i = toggle interactor (animator) tracing\n"
              << "m = grow visible animate rectangle\n"
              << "o = toggle animation on 1st option menu\n"
              << "p = test polygon animation\n"
              << "e = toggle eye walking" << std::endl
#ifdef TESTUSEPIXMAPS
              << "For icons:\n"
              << "   g = toggle girl\n"
              << "   d = toggle dog animation\n"
              << "   b = toggle bug\n"
              << "   v = toggle visible on group (fade out)\n"
              << "   V = toggle visible on dog (fly away)\n"
#endif
              << " A = blink wiggler visible\n"
              << " B = blink wiggler blue and green\n"
              << " N = create new window with animated button\n"
              << "q to quit" << std::endl
              << std::flush;
}